

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O0

void __thiscall ConstantValue::saveXml(ConstantValue *this,ostream *s)

{
  ostream *poVar1;
  void *this_00;
  ostream *s_local;
  ConstantValue *this_local;
  
  poVar1 = std::operator<<(s,"<intb val=\"");
  this_00 = (void *)std::ostream::operator<<(poVar1,std::dec);
  poVar1 = (ostream *)std::ostream::operator<<(this_00,this->val);
  std::operator<<(poVar1,"\"/>\n");
  return;
}

Assistant:

void ConstantValue::saveXml(ostream &s) const

{
  s << "<intb val=\"" << dec << val << "\"/>\n";
}